

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawRotateHandles(XFormWidget *this)

{
  const_reference pvVar1;
  const_reference this_00;
  const_reference pvVar2;
  long in_RDI;
  XFormWidget *in_stack_00000050;
  Vector3D q2;
  Vector3D q1;
  double theta2;
  double theta1;
  int j;
  Vector3D e2;
  Vector3D e1;
  int i;
  double r;
  Vector3D c;
  int nSides;
  double boxSize;
  Vector3D *in_stack_fffffffffffffe50;
  Vector3D *in_stack_fffffffffffffe58;
  undefined1 local_140 [24];
  double local_128;
  double local_108;
  undefined1 local_b8 [24];
  double local_a0;
  double local_98;
  int local_8c;
  Vector3D local_88;
  Vector3D local_70;
  int local_54;
  double local_38;
  Vector3D local_30;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x3fc999999999999a;
  local_14 = 0x40;
  if (*(long *)(in_RDI + 0xf0) != 0) {
    Vector3D::Vector3D(&local_30,(Vector3D *)(in_RDI + 0x1b8));
    Vector3D::operator-(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    local_38 = Vector3D::norm((Vector3D *)0x215281);
    local_38 = local_38 / 2.0;
    glLineWidth(0x41000000);
    glBegin(1);
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                          (in_RDI + 0x158),(long)((local_54 + 1) % 3));
      Vector3D::Vector3D(&local_70,pvVar1);
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                          (in_RDI + 0x158),(long)((local_54 + 2) % 3));
      Vector3D::Vector3D(&local_88,pvVar1);
      this_00 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)(in_RDI + 0x200),(long)local_54);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
      glColor4ubv(pvVar2);
      for (local_8c = 0; local_8c < 0x40; local_8c = local_8c + 1) {
        local_98 = ((double)local_8c * 6.283185307179586) / 64.0;
        local_a0 = ((double)(local_8c + 1) * 6.283185307179586) / 64.0;
        local_108 = cos(local_98);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        local_128 = sin(local_98);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        Vector3D::operator-(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        Vector3D::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        cos(local_a0);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        in_stack_fffffffffffffe50 = (Vector3D *)sin(local_a0);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        Vector3D::operator-(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        CMU462::operator*(&in_stack_fffffffffffffe58->x,in_stack_fffffffffffffe50);
        Vector3D::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        glVertex3dv(local_b8);
        glVertex3dv(local_140);
      }
    }
    glEnd();
    drawCenterHandle(in_stack_00000050);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawRotateHandles() const {
  const double boxSize = .2;
  const int nSides = 64;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D e1 = axes[(i + 1) % 3];
    Vector3D e2 = axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)(j + 0) / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;

      Vector3D q1 = c + r * (cos(theta1) * e1 - sin(theta1) * e2);
      Vector3D q2 = c + r * (cos(theta2) * e1 - sin(theta2) * e2);

      glVertex3dv(&q1.x);
      glVertex3dv(&q2.x);
    }
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}